

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> * __thiscall
wasm::WATParser::anon_unknown_11::makeBrOnCast<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,anon_unknown_11 *this,
          ParseDefsCtx *ctx,Index pos,optional<wasm::Type> castType,bool onFail)

{
  undefined4 in_register_0000000c;
  allocator<char> local_71;
  string local_70;
  Err local_50;
  byte local_2d;
  undefined4 local_2c;
  bool onFail_local;
  anon_unknown_11 *paStack_28;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  optional<wasm::Type> castType_local;
  
  ctx_local = (ParseDefsCtx *)CONCAT44(in_register_0000000c,pos);
  castType_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
       castType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload._0_1_;
  local_2c = SUB84(ctx,0);
  local_2d = castType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged & 1;
  paStack_28 = this;
  castType_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"unimplemented instruction",&local_71);
  ParseInput::err(&local_50,(ParseInput *)(this + 8),&local_70);
  Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_50);
  WATParser::Err::~Err(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeBrOnCast(Ctx& ctx, Index pos, std::optional<Type> castType, bool onFail) {
  return ctx.in.err("unimplemented instruction");
}